

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_output.hpp
# Opt level: O0

void write_output<std::vector<unsigned_short,std::allocator<unsigned_short>>>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *primes,endian output_endian
               ,ostream *os)

{
  pointer puVar1;
  bool bVar2;
  size_type sVar3;
  reference puVar4;
  uchar *puVar5;
  const_iterator cStack_a8;
  unsigned_short v_2;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2_2;
  const_iterator cStack_88;
  unsigned_short v_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2_1;
  const_iterator cStack_68;
  unsigned_short v;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  uchar *ptr;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  ostream *os_local;
  endian output_endian_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *primes_local;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)os;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(primes);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,sVar3 * 2);
  __range2 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  if (output_endian == native) {
    __end0_2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(primes);
    cStack_a8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(primes);
    while (bVar2 = __gnu_cxx::operator!=(&__end0_2,&stack0xffffffffffffff58), bVar2) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&__end0_2);
      __range2 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 write<unsigned_short,(endian)0>(*puVar4,(uint8_t *)__range2);
      __gnu_cxx::
      __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&__end0_2);
    }
  }
  else if (output_endian == big) {
    __end0 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(primes);
    cStack_68 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(primes);
    while (bVar2 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff98), bVar2) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&__end0);
      __range2 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 write<unsigned_short,(endian)1>(*puVar4,(uint8_t *)__range2);
      __gnu_cxx::
      __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&__end0);
    }
  }
  else if (output_endian == little) {
    __end0_1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(primes);
    cStack_88 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(primes);
    while (bVar2 = __gnu_cxx::operator!=(&__end0_1,&stack0xffffffffffffff78), bVar2) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&__end0_1);
      __range2 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 write<unsigned_short,(endian)2>(*puVar4,(uint8_t *)__range2);
      __gnu_cxx::
      __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&__end0_1);
    }
  }
  puVar1 = bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  std::ostream::write((char *)puVar1,(long)puVar5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void write_output (ContainerType const & primes, endian output_endian, std::ostream & os) {

    using int_type = typename ContainerType::value_type;
    std::vector<std::uint8_t> bytes;
    bytes.resize (primes.size () * sizeof (int_type));
    auto ptr = bytes.data ();
    switch (output_endian) {
    case endian::big:
        for (auto v : primes) {
            ptr = write<int_type, endian::big> (v, ptr);
        }
        break;
    case endian::little:
        for (auto v : primes) {
            ptr = write<int_type, endian::little> (v, ptr);
        }
        break;
    case endian::native:
        for (auto v : primes) {
            ptr = write<int_type, endian::native> (v, ptr);
        }
        break;
    }
    os.write (reinterpret_cast<std::ofstream::char_type const *> (bytes.data ()),
              static_cast<std::streamsize> (sizeof (std::uint8_t) * bytes.size ()));
}